

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

int __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::GetCachedSize(MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  
  iVar3 = 0;
  iVar2 = 0;
  if ((this->_has_bits_[0] & 1) != 0) {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])(this);
    uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 8);
    uVar4 = uVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    iVar2 = uVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])(this);
    uVar1 = *(uint *)(CONCAT44(extraout_var_00,iVar3) + 0x90);
    uVar4 = uVar1 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    iVar3 = uVar1 + (iVar3 * 9 + 0x49U >> 6) + 1;
  }
  return iVar3 + iVar2;
}

Assistant:

int GetCachedSize() const override {
    int size = 0;
    size += has_key() ? static_cast<int>(kTagSize) +
                            KeyTypeHandler::GetCachedSize(key())
                      : 0;
    size += has_value() ? static_cast<int>(kTagSize) +
                              ValueTypeHandler::GetCachedSize(value())
                        : 0;
    return size;
  }